

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O1

Url * __thiscall kj::Url::parseRelative(Url *__return_storage_ptr__,Url *this,StringPtr url)

{
  bool bVar1;
  StringPtr url_local;
  Maybe<kj::Url> local_2c8;
  NullableValue<kj::Url> _kj_result;
  Url local_f0;
  
  url_local.content.size_ = url.content.size_;
  url_local.content.ptr = url.content.ptr;
  tryParseRelative(&local_2c8,this,url);
  _kj_result.isSet = local_2c8.ptr.isSet;
  if (local_2c8.ptr.isSet == true) {
    Url(&_kj_result.field_1.value,&local_2c8.ptr.field_1.value);
  }
  if (local_2c8.ptr.isSet == true) {
    ~Url(&local_2c8.ptr.field_1.value);
  }
  bVar1 = _kj_result.isSet;
  if (_kj_result.isSet != false) {
    Url(&local_f0,&_kj_result.field_1.value);
    if (_kj_result.isSet == true) {
      ~Url(&_kj_result.field_1.value);
    }
    Url(__return_storage_ptr__,&local_f0);
    if (bVar1 == true) {
      ~Url(&local_f0);
    }
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21],kj::StringPtr&>
            ((Fault *)&local_2c8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
             ,0x117,FAILED,"tryParseRelative(url) != nullptr","\"invalid relative URL\", url",
             (char (*) [21])"invalid relative URL",&url_local);
  kj::_::Debug::Fault::fatal((Fault *)&local_2c8);
}

Assistant:

Url Url::parseRelative(StringPtr url) const {
  return KJ_REQUIRE_NONNULL(tryParseRelative(url), "invalid relative URL", url);
}